

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu384a_com.c
# Opt level: O3

RK_S32 vdpu384a_check_rcb_buf_size(Vdpu384aRcbInfo *info,RK_S32 width,RK_S32 height)

{
  undefined8 in_RAX;
  long lVar1;
  RK_S32 *pRVar2;
  
  pRVar2 = &info->size;
  lVar1 = 0;
  do {
    if ((int)(*(int *)((long)rcb_coeff + lVar1) * width + 0x3fU & 0xffffffc0) <= *pRVar2) {
      in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),0x46);
      _mpp_log_l(2,"vdpu384a_com","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "info[i].size < (RK_S32)(((width * rcb_coeff[i])+((64))-1)&~(((64))-1))",
                 "vdpu384a_check_rcb_buf_size",in_RAX);
      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0026d2f6;
    }
    lVar1 = lVar1 + 4;
    pRVar2 = pRVar2 + 3;
  } while (lVar1 != 0x24);
  pRVar2 = &info[9].size;
  lVar1 = 0;
  do {
    if ((int)(rcb_coeff[lVar1 + 9] * height + 0x3f & 0xffffffc0) <= *pRVar2) {
      in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),0x49);
      _mpp_log_l(2,"vdpu384a_com","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "info[i].size < (RK_S32)(((height * rcb_coeff[i])+((64))-1)&~(((64))-1))",
                 "vdpu384a_check_rcb_buf_size",in_RAX);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_0026d2f6:
        abort();
      }
    }
    lVar1 = lVar1 + 1;
    pRVar2 = pRVar2 + 3;
    if (lVar1 == 2) {
      return 0;
    }
  } while( true );
}

Assistant:

RK_RET vdpu384a_check_rcb_buf_size(Vdpu384aRcbInfo *info, RK_S32 width, RK_S32 height)
{
    RK_U32 i;

    for (i = 0; i < RCB_FILTERD_TILE_COL; i++)
        mpp_assert(info[i].size < (RK_S32)MPP_ALIGN(width * rcb_coeff[i], RCB_ALLINE_SIZE));

    for (i = RCB_FILTERD_TILE_COL; i < RCB_BUF_COUNT; i++)
        mpp_assert(info[i].size < (RK_S32)MPP_ALIGN(height * rcb_coeff[i], RCB_ALLINE_SIZE));

    return MPP_OK;
}